

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::KcpConnection::~KcpConnection(KcpConnection *this)

{
  _Atomic_word *p_Var1;
  ulong __n;
  char *pcVar2;
  Channel *this_00;
  pointer pcVar3;
  _Manager_type p_Var4;
  InetAddress *pIVar5;
  pointer pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int iVar8;
  LogStream *pLVar9;
  uint uVar10;
  char **ppcVar11;
  char *in_RSI;
  SourceFile file;
  Logger local_ff0;
  
  if (g_logLevel < 2) {
    file._8_8_ = 0x11;
    file.m_data = "KcpConnection.cpp";
    Logger::Logger(&local_ff0,file,0x3a,DEBUG,"~KcpConnection");
    iVar8 = (int)&local_ff0.m_impl.m_stream.m_buffer.m_cur;
    uVar10 = iVar8 - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur;
    if (0x14 < uVar10) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,"KcpConnection::dtor[",0x14);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 0x14;
      uVar10 = iVar8 - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(int)uVar10) {
      memcpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + __n;
      uVar10 = iVar8 - (int)local_ff0.m_impl.m_stream.m_buffer.m_cur;
    }
    if (5 < uVar10) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,"] at ",5);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    pLVar9 = LogStream::operator<<(&local_ff0.m_impl.m_stream,this);
    pcVar2 = (pLVar9->m_buffer).m_cur;
    ppcVar11 = &(pLVar9->m_buffer).m_cur;
    if (4 < (uint)((int)ppcVar11 - (int)pcVar2)) {
      builtin_strncpy(pcVar2," id=",4);
      *ppcVar11 = *ppcVar11 + 4;
    }
    pLVar9 = LogStream::operator<<(pLVar9,this->m_id);
    pcVar2 = (pLVar9->m_buffer).m_cur;
    ppcVar11 = &(pLVar9->m_buffer).m_cur;
    if (((int)ppcVar11 - (int)pcVar2 & 0xfffffff8U) != 0) {
      builtin_strncpy(pcVar2," state=",7);
      *ppcVar11 = *ppcVar11 + 7;
    }
    if ((ulong)this->m_state < 5) {
      in_RSI = *(char **)(&DAT_0014f4f8 + (ulong)this->m_state * 8);
    }
    else {
      in_RSI = "unknown state";
    }
    LogStream::operator<<(pLVar9,in_RSI);
    Logger::~Logger(&local_ff0);
  }
  if (this->m_state == kDisconnected) {
    if (this->m_kcp != (ikcpcb *)0x0) {
      ikcp_release(this->m_kcp);
      this->m_kcp = (ikcpcb *)0x0;
    }
    this_00 = (this->m_udpChannel)._M_t.
              super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
              _M_t.
              super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
              .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    if ((this_00 != (Channel *)0x0) && (this->m_isClient == true)) {
      this_00->m_events = 0;
      Channel::update(this_00);
      Channel::remove((this->m_udpChannel)._M_t.
                      super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                      .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,in_RSI);
    }
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_udpChannel);
    pcVar3 = (this->m_outputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (pcVar3 != (pointer)0x0) {
      operator_delete(pcVar3);
    }
    pcVar3 = (this->m_inputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar3 != (pointer)0x0) {
      operator_delete(pcVar3);
    }
    p_Var4 = (this->m_kcpCloseCallback).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      (*p_Var4)((_Any_data *)&this->m_kcpCloseCallback,(_Any_data *)&this->m_kcpCloseCallback,
                __destroy_functor);
    }
    p_Var4 = (this->m_kcpHighWaterMarkCallback).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      (*p_Var4)((_Any_data *)&this->m_kcpHighWaterMarkCallback,
                (_Any_data *)&this->m_kcpHighWaterMarkCallback,__destroy_functor);
    }
    p_Var4 = (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      (*p_Var4)((_Any_data *)&this->m_kcpWriteCompleteCallback,
                (_Any_data *)&this->m_kcpWriteCompleteCallback,__destroy_functor);
    }
    p_Var4 = (this->m_kcpMessageCallback).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      (*p_Var4)((_Any_data *)&this->m_kcpMessageCallback,(_Any_data *)&this->m_kcpMessageCallback,
                __destroy_functor);
    }
    p_Var4 = (this->m_kcpConnectionCallback).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      (*p_Var4)((_Any_data *)&this->m_kcpConnectionCallback,
                (_Any_data *)&this->m_kcpConnectionCallback,__destroy_functor);
    }
    pIVar5 = (this->m_peerAddr)._M_t.
             super___uniq_ptr_impl<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>
             ._M_t.
             super__Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_>
             .super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl;
    if (pIVar5 != (InetAddress *)0x0) {
      operator_delete(pIVar5);
    }
    (this->m_peerAddr)._M_t.
    super___uniq_ptr_impl<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>.
    _M_t.
    super__Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_>
    .super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl = (InetAddress *)0x0;
    pcVar6 = (this->m_name)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &(this->m_name).field_2) {
      operator_delete(pcVar6);
    }
    Socket::~Socket(&this->m_udpSocket);
    p_Var7 = (this->super_enable_shared_from_this<sznet::net::KcpConnection>)._M_weak_this.
             super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var7->_M_weak_count;
        iVar8 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = p_Var7->_M_weak_count;
        p_Var7->_M_weak_count = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (*p_Var7->_vptr__Sp_counted_base[3])();
      }
    }
    return;
  }
  __assert_fail("m_state == kDisconnected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                ,0x3d,"sznet::net::KcpConnection::~KcpConnection()");
}

Assistant:

KcpConnection::~KcpConnection()
{
	LOG_DEBUG << "KcpConnection::dtor[" << m_name << "] at " << this
		<< " id=" << m_id
		<< " state=" << stateToString();
	assert(m_state == kDisconnected);
	if (m_kcp)
	{
		ikcp_release(m_kcp);
		m_kcp = nullptr;
	}
	if (m_udpChannel && m_isClient)
	{
		m_udpChannel->disableAll();
		m_udpChannel->remove();
	}
}